

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# share.c
# Opt level: O1

CURLSHcode curl_share_setopt(CURLSH *sh,CURLSHoption option,...)

{
  byte bVar1;
  CookieInfo *pCVar2;
  CURLSHcode CVar3;
  va_list param;
  undefined8 local_b8;
  
  if (*(int *)((long)sh + 4) != 0) {
    return CURLSHE_IN_USE;
  }
  CVar3 = CURLSHE_BAD_OPTION;
  switch(option) {
  case CURLSHOPT_SHARE:
    *(uint *)sh = *sh | 1 << ((byte)local_b8 & 0x1f);
    switch((undefined4)local_b8) {
    case 2:
      goto switchD_0057d9aa_caseD_2;
    default:
      return CURLSHE_OK;
    case 4:
switchD_0057d89b_default:
      return CURLSHE_NOT_BUILT_IN;
    }
  case CURLSHOPT_UNSHARE:
    bVar1 = (byte)local_b8 & 0x1f;
    *(uint *)sh = *sh & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    switch((undefined4)local_b8) {
    case 2:
      if (*(CookieInfo **)((long)sh + 0x50) == (CookieInfo *)0x0) {
        return CURLSHE_OK;
      }
      Curl_cookie_cleanup(*(CookieInfo **)((long)sh + 0x50));
      *(undefined8 *)((long)sh + 0x50) = 0;
      return CURLSHE_OK;
    default:
      return CURLSHE_OK;
    case 4:
      goto switchD_0057d89b_default;
    }
  case CURLSHOPT_LOCKFUNC:
    *(undefined8 *)((long)sh + 8) = local_b8;
    break;
  case CURLSHOPT_UNLOCKFUNC:
    *(undefined8 *)((long)sh + 0x10) = local_b8;
    break;
  case CURLSHOPT_USERDATA:
    *(undefined8 *)((long)sh + 0x18) = local_b8;
    break;
  default:
    goto switchD_0057d89b_default;
  }
  CVar3 = CURLSHE_OK;
switchD_0057d89b_default:
  return CVar3;
switchD_0057d9aa_caseD_2:
  if (*(long *)((long)sh + 0x50) != 0) {
    return CURLSHE_OK;
  }
  pCVar2 = Curl_cookie_init((SessionHandle *)0x0,(char *)0x0,(CookieInfo *)0x0,true);
  *(CookieInfo **)((long)sh + 0x50) = pCVar2;
  return (uint)(pCVar2 == (CookieInfo *)0x0) << 2;
}

Assistant:

CURLSHcode
curl_share_setopt(CURLSH *sh, CURLSHoption option, ...)
{
  struct Curl_share *share = (struct Curl_share *)sh;
  va_list param;
  int type;
  curl_lock_function lockfunc;
  curl_unlock_function unlockfunc;
  void *ptr;
  CURLSHcode res = CURLSHE_OK;

  if(share->dirty)
    /* don't allow setting options while one or more handles are already
       using this share */
    return CURLSHE_IN_USE;

  va_start(param, option);

  switch(option) {
  case CURLSHOPT_SHARE:
    /* this is a type this share will share */
    type = va_arg(param, int);
    share->specifier |= (1<<type);
    switch( type ) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(!share->cookies) {
        share->cookies = Curl_cookie_init(NULL, NULL, NULL, TRUE );
        if(!share->cookies)
          res = CURLSHE_NOMEM;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      if(!share->sslsession) {
        share->max_ssl_sessions = 8;
        share->sslsession = calloc(share->max_ssl_sessions,
                                   sizeof(struct curl_ssl_session));
        share->sessionage = 0;
        if(!share->sslsession)
          res = CURLSHE_NOMEM;
      }
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:     /* not supported (yet) */
      break;

    default:
      res = CURLSHE_BAD_OPTION;
    }
    break;

  case CURLSHOPT_UNSHARE:
    /* this is a type this share will no longer share */
    type = va_arg(param, int);
    share->specifier &= ~(1<<type);
    switch( type ) {
    case CURL_LOCK_DATA_DNS:
      break;

    case CURL_LOCK_DATA_COOKIE:
#if !defined(CURL_DISABLE_HTTP) && !defined(CURL_DISABLE_COOKIES)
      if(share->cookies) {
        Curl_cookie_cleanup(share->cookies);
        share->cookies = NULL;
      }
#else   /* CURL_DISABLE_HTTP */
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_SSL_SESSION:
#ifdef USE_SSL
      Curl_safefree(share->sslsession);
#else
      res = CURLSHE_NOT_BUILT_IN;
#endif
      break;

    case CURL_LOCK_DATA_CONNECT:
      break;

    default:
      res = CURLSHE_BAD_OPTION;
      break;
    }
    break;

  case CURLSHOPT_LOCKFUNC:
    lockfunc = va_arg(param, curl_lock_function);
    share->lockfunc = lockfunc;
    break;

  case CURLSHOPT_UNLOCKFUNC:
    unlockfunc = va_arg(param, curl_unlock_function);
    share->unlockfunc = unlockfunc;
    break;

  case CURLSHOPT_USERDATA:
    ptr = va_arg(param, void *);
    share->clientdata = ptr;
    break;

  default:
    res = CURLSHE_BAD_OPTION;
    break;
  }

  va_end(param);

  return res;
}